

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

void lddmc_gc_mark_serialize_CALL(WorkerP *w,Task *__dq_head)

{
  avl_iter_t *iter;
  avl_node_t *paVar1;
  
  iter = avl_iter(lddmc_ser_set);
  while( true ) {
    paVar1 = avl_iter_next(iter);
    if (paVar1 == (avl_node_t *)0x0) break;
    lddmc_gc_mark_rec_CALL(w,__dq_head,(MDD)paVar1[1].left);
  }
  return;
}

Assistant:

VOID_TASK_IMPL_0(lddmc_gc_mark_serialize)
{
    struct lddmc_ser *s;
    avl_iter_t *it = lddmc_ser_iter(lddmc_ser_set);

    /* Iterate through nodes in serialization */
    while ((s=lddmc_ser_iter_next(it))) {
        CALL(lddmc_gc_mark_rec, s->mdd);
    }
}